

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O0

uint __thiscall QFileInfoPrivate::getFileFlags(QFileInfoPrivate *this,FileFlags request)

{
  uint uVar1;
  bool bVar2;
  FileFlags FVar3;
  Int IVar4;
  pointer pQVar5;
  QFileInfoPrivate *in_RDI;
  long in_FS_OFFSET;
  uint cachedFlags;
  FileFlags flags;
  FileFlags req;
  FileFlag in_stack_ffffffffffffffac;
  QFlagsStorage<QAbstractFileEngine::FileFlag> in_stack_ffffffffffffffb8;
  uint local_34;
  QFlagsStorage<QAbstractFileEngine::FileFlag> local_24;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_20;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_1c;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_18;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_14;
  QFlagsStorage<QAbstractFileEngine::FileFlag> local_10;
  QFlags<QAbstractFileEngine::FileFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = 0xaaaaaaaa;
  QFlags<QAbstractFileEngine::FileFlag>::QFlags((QFlags<QAbstractFileEngine::FileFlag> *)0x11f7fd);
  local_34 = 0;
  operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
  local_14.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
       (QFlagsStorage<QAbstractFileEngine::FileFlag>)
       QFlags<QAbstractFileEngine::FileFlag>::operator&
                 ((QFlags<QAbstractFileEngine::FileFlag> *)in_RDI,
                  (QFlags<QAbstractFileEngine::FileFlag>)in_stack_ffffffffffffffb8.i);
  bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
  if (bVar2) {
    bVar2 = getCachedFlag(in_RDI,1);
    if (!bVar2) {
      QFlags<QAbstractFileEngine::FileFlag>::operator|=
                ((QFlags<QAbstractFileEngine::FileFlag> *)&local_10,FlagsMask);
      QFlags<QAbstractFileEngine::FileFlag>::operator|=
                ((QFlags<QAbstractFileEngine::FileFlag> *)&local_10,TypesMask);
      FVar3 = operator~((enum_type)((ulong)in_RDI >> 0x20));
      QFlags<QAbstractFileEngine::FileFlag>::operator&=
                ((QFlags<QAbstractFileEngine::FileFlag> *)&local_10,
                 (QFlags<QAbstractFileEngine::FileFlag>)
                 FVar3.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
                 super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i);
      FVar3 = operator~((enum_type)((ulong)in_RDI >> 0x20));
      QFlags<QAbstractFileEngine::FileFlag>::operator&=
                ((QFlags<QAbstractFileEngine::FileFlag> *)&local_10,
                 (QFlags<QAbstractFileEngine::FileFlag>)
                 FVar3.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
                 super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i);
    }
    local_34 = (uint)!bVar2;
    local_18.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
         (QFlagsStorage<QAbstractFileEngine::FileFlag>)
         QFlags<QAbstractFileEngine::FileFlag>::operator&
                   ((QFlags<QAbstractFileEngine::FileFlag> *)in_RDI,in_stack_ffffffffffffffac);
    bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_18);
    if ((bVar2) && (bVar2 = getCachedFlag(in_RDI,2), !bVar2)) {
      QFlags<QAbstractFileEngine::FileFlag>::operator|=
                ((QFlags<QAbstractFileEngine::FileFlag> *)&local_10,LinkType);
      local_34 = local_34 | 2;
    }
    local_1c.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
         (QFlagsStorage<QAbstractFileEngine::FileFlag>)
         QFlags<QAbstractFileEngine::FileFlag>::operator&
                   ((QFlags<QAbstractFileEngine::FileFlag> *)in_RDI,in_stack_ffffffffffffffac);
    bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1c);
    if ((bVar2) && (bVar2 = getCachedFlag(in_RDI,4), !bVar2)) {
      QFlags<QAbstractFileEngine::FileFlag>::operator|=
                ((QFlags<QAbstractFileEngine::FileFlag> *)&local_10,BundleType);
      local_34 = local_34 | 4;
    }
  }
  local_20.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
       (QFlagsStorage<QAbstractFileEngine::FileFlag>)
       QFlags<QAbstractFileEngine::FileFlag>::operator&
                 ((QFlags<QAbstractFileEngine::FileFlag> *)in_RDI,in_stack_ffffffffffffffac);
  bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_20);
  if ((bVar2) && (bVar2 = getCachedFlag(in_RDI,0x100), !bVar2)) {
    QFlags<QAbstractFileEngine::FileFlag>::operator|=
              ((QFlags<QAbstractFileEngine::FileFlag> *)&local_10,PermsMask);
    local_34 = local_34 | 0x100;
  }
  bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_10);
  if (bVar2) {
    if (*(int *)&in_RDI->field_0x1d8 < 0) {
      FVar3 = operator~((enum_type)((ulong)in_RDI >> 0x20));
      QFlags<QAbstractFileEngine::FileFlag>::operator&=
                ((QFlags<QAbstractFileEngine::FileFlag> *)&local_10,
                 (QFlags<QAbstractFileEngine::FileFlag>)
                 FVar3.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
                 super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i);
    }
    else {
      QFlags<QAbstractFileEngine::FileFlag>::operator|=
                ((QFlags<QAbstractFileEngine::FileFlag> *)&local_10,Refresh);
    }
    local_24.i = 0xaaaaaaaa;
    pQVar5 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x11fa18);
    local_24.i = (*pQVar5->_vptr_QAbstractFileEngine[0x16])(pQVar5,(ulong)local_10.i);
    IVar4 = QFlags<QAbstractFileEngine::FileFlag>::toInt
                      ((QFlags<QAbstractFileEngine::FileFlag> *)&local_24);
    in_RDI->fileFlags = IVar4 | in_RDI->fileFlags;
    setCachedFlag(in_RDI,local_34);
  }
  uVar1 = in_RDI->fileFlags;
  IVar4 = QFlags<QAbstractFileEngine::FileFlag>::toInt(&local_c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return uVar1 & IVar4;
}

Assistant:

uint QFileInfoPrivate::getFileFlags(QAbstractFileEngine::FileFlags request) const
{
    Q_ASSERT(fileEngine); // should never be called when using the native FS
    // We split the testing into tests for for LinkType, BundleType, PermsMask
    // and the rest.
    // Tests for file permissions on Windows can be slow, especially on network
    // paths and NTFS drives.
    // In order to determine if a file is a symlink or not, we have to lstat().
    // If we're not interested in that information, we might as well avoid one
    // extra syscall. Bundle detecton on Mac can be slow, especially on network
    // paths, so we separate out that as well.

    QAbstractFileEngine::FileFlags req;
    uint cachedFlags = 0;

    if (request & (QAbstractFileEngine::FlagsMask | QAbstractFileEngine::TypesMask)) {
        if (!getCachedFlag(CachedFileFlags)) {
            req |= QAbstractFileEngine::FlagsMask;
            req |= QAbstractFileEngine::TypesMask;
            req &= (~QAbstractFileEngine::LinkType);
            req &= (~QAbstractFileEngine::BundleType);

            cachedFlags |= CachedFileFlags;
        }

        if (request & QAbstractFileEngine::LinkType) {
            if (!getCachedFlag(CachedLinkTypeFlag)) {
                req |= QAbstractFileEngine::LinkType;
                cachedFlags |= CachedLinkTypeFlag;
            }
        }

        if (request & QAbstractFileEngine::BundleType) {
            if (!getCachedFlag(CachedBundleTypeFlag)) {
                req |= QAbstractFileEngine::BundleType;
                cachedFlags |= CachedBundleTypeFlag;
            }
        }
    }

    if (request & QAbstractFileEngine::PermsMask) {
        if (!getCachedFlag(CachedPerms)) {
            req |= QAbstractFileEngine::PermsMask;
            cachedFlags |= CachedPerms;
        }
    }

    if (req) {
        if (cache_enabled)
            req &= (~QAbstractFileEngine::Refresh);
        else
            req |= QAbstractFileEngine::Refresh;

        QAbstractFileEngine::FileFlags flags = fileEngine->fileFlags(req);
        fileFlags |= uint(flags.toInt());
        setCachedFlag(cachedFlags);
    }

    return fileFlags & request.toInt();
}